

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::tracker_reply_alert::~tracker_reply_alert(tracker_reply_alert *this)

{
  tracker_alert::~tracker_alert(&this->super_tracker_alert);
  operator_delete(this,0x98);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_reply_alert final : tracker_alert
	{
		// internal
		tracker_reply_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, int np, string_view u);

		TORRENT_DEFINE_ALERT(tracker_reply_alert, 15)

		static constexpr alert_category_t static_category = alert_category::tracker;
		std::string message() const override;

		// tells how many peers the tracker returned in this response. This is
		// not expected to be greater than the ``num_want`` settings. These are not necessarily
		// all new peers, some of them may already be connected.
		int const num_peers;
	}